

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cc
# Opt level: O1

Time absl::Now(void)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  Time TVar5;
  
  uVar1 = GetCurrentTimeNanos();
  if ((long)uVar1 < 0) {
    lVar4 = (long)uVar1 % 1000000000;
    uVar2 = (lVar4 >> 0x3d) + (long)uVar1 / 1000000000;
    iVar3 = (int)lVar4 * 4 + -0x1194d800;
    if (-1 < lVar4) {
      iVar3 = (int)lVar4 * 4;
    }
  }
  else {
    uVar2 = uVar1 / 1000000000;
    iVar3 = ((int)uVar1 + (int)uVar2 * -1000000000) * 4;
  }
  TVar5.rep_.rep_lo_ = iVar3;
  TVar5.rep_.rep_hi_ = uVar2;
  TVar5.rep_._12_4_ = 0;
  return (Time)TVar5.rep_;
}

Assistant:

ABSL_NAMESPACE_BEGIN
Time Now() {
  // TODO(bww): Get a timespec instead so we don't have to divide.
  int64_t n = absl::GetCurrentTimeNanos();
  if (n >= 0) {
    return time_internal::FromUnixDuration(
        time_internal::MakeDuration(n / 1000000000, n % 1000000000 * 4));
  }
  return time_internal::FromUnixDuration(absl::Nanoseconds(n));
}